

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

IterationResult __thiscall helics::FederateState::waitSetup(FederateState *this)

{
  __atomic_flag_data_type _Var1;
  FederateStates FVar2;
  IterationResult IVar3;
  
  LOCK();
  _Var1 = (this->processing).super___atomic_flag_base._M_i;
  (this->processing).super___atomic_flag_base._M_i = true;
  UNLOCK();
  if (_Var1 == false) {
    IVar3 = processQueue(this);
  }
  else {
    sleeplock(this);
    FVar2 = (this->state)._M_i;
    if (FVar2 == FINISHED) {
      IVar3 = HALTED;
    }
    else if (FVar2 == ERRORED) {
      IVar3 = ERROR_RESULT;
    }
    else if (FVar2 == CREATED) {
      IVar3 = waitSetup(this);
    }
    else {
      IVar3 = NEXT_STEP;
    }
  }
  LOCK();
  (this->processing).super___atomic_flag_base._M_i = false;
  UNLOCK();
  return IVar3;
}

Assistant:

IterationResult FederateState::waitSetup()
{
    if (try_lock()) {  // only enter this loop once per federate
        auto ret = processQueue();
        unlock();
        return static_cast<IterationResult>(ret);
    }
    // this function can fail try_lock gracefully

    const std::lock_guard<FederateState> fedlock(*this);
    IterationResult ret;
    switch (getState()) {
        case FederateStates::CREATED: {  // we are still in the created state
            return waitSetup();
        }
        case FederateStates::ERRORED:
            ret = IterationResult::ERROR_RESULT;
            break;
        case FederateStates::FINISHED:
            ret = IterationResult::HALTED;
            break;
        default:
            ret = IterationResult::NEXT_STEP;
            break;
    }

    return ret;
}